

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

void __thiscall
tcu::PixelBufferAccess::setPixel(PixelBufferAccess *this,Vec4 *color,int x,int y,int z)

{
  float src;
  float src_00;
  float src_01;
  ChannelType type;
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  deUint32 dVar5;
  deUint32 dVar6;
  deUint32 dVar7;
  TextureSwizzle *pTVar8;
  uint uVar9;
  ulong uVar10;
  int bits;
  ushort uVar11;
  ChannelOrder order;
  uint *dst;
  UVec4 swizzled;
  Vector<float,_4> local_44;
  Float<unsigned_int,_5,_5,_15,_2U> local_34;
  
  dst = (uint *)((long)(this->super_ConstPixelBufferAccess).m_data +
                (long)(z * (this->super_ConstPixelBufferAccess).m_pitch.m_data[2]) +
                (long)(y * (this->super_ConstPixelBufferAccess).m_pitch.m_data[1]) +
                (long)(x * (this->super_ConstPixelBufferAccess).m_pitch.m_data[0]));
  type = (this->super_ConstPixelBufferAccess).m_format.type;
  switch(type) {
  case UNORM_INT8:
    order = (this->super_ConstPixelBufferAccess).m_format.order;
    switch(order) {
    case RGB:
    case sRGB:
      bVar1 = floatToU8(color->m_data[0]);
      *(byte *)dst = bVar1;
      bVar1 = floatToU8(color->m_data[1]);
      *(byte *)((long)dst + 1) = bVar1;
      bVar1 = floatToU8(color->m_data[2]);
      *(byte *)((long)dst + 2) = bVar1;
      break;
    case RGBA:
    case sRGBA:
      bVar1 = floatToU8(color->m_data[0]);
      *(byte *)dst = bVar1;
      bVar1 = floatToU8(color->m_data[1]);
      *(byte *)((long)dst + 1) = bVar1;
      bVar1 = floatToU8(color->m_data[2]);
      *(byte *)((long)dst + 2) = bVar1;
      bVar1 = floatToU8(color->m_data[3]);
      *(byte *)((long)dst + 3) = bVar1;
      break;
    default:
      goto switchD_0160356e_caseD_9;
    }
    break;
  default:
    order = (this->super_ConstPixelBufferAccess).m_format.order;
switchD_0160356e_caseD_9:
    uVar3 = getNumUsedChannels(order);
    pTVar8 = getChannelWriteSwizzle(order);
    uVar4 = getChannelSize(type);
    for (uVar10 = 0; uVar3 != uVar10; uVar10 = uVar10 + 1) {
      anon_unknown_74::floatToChannel
                ((deUint8 *)dst,color->m_data[(int)pTVar8->components[uVar10]],
                 (this->super_ConstPixelBufferAccess).m_format.type);
      dst = (uint *)((long)dst + (ulong)uVar4);
    }
    break;
  case UNORM_BYTE_44:
    dVar5 = anon_unknown_74::unormFloatToChannel(color->m_data[0],4);
    dVar6 = anon_unknown_74::unormFloatToChannel(color->m_data[1],4);
    *(byte *)dst = (byte)dVar6 | (byte)(dVar5 << 4);
    break;
  case UNORM_SHORT_565:
    swizzleRB<float>((tcu *)&swizzled,color,RGB,(this->super_ConstPixelBufferAccess).m_format.order)
    ;
    dVar5 = anon_unknown_74::unormFloatToChannel((float)swizzled.m_data[0],5);
    uVar11 = (ushort)(dVar5 << 0xb);
    bits = 6;
    goto LAB_016038c1;
  case UNORM_SHORT_555:
    swizzleRB<float>((tcu *)&swizzled,color,RGB,(this->super_ConstPixelBufferAccess).m_format.order)
    ;
    bits = 5;
    dVar5 = anon_unknown_74::unormFloatToChannel((float)swizzled.m_data[0],5);
    uVar11 = (ushort)(dVar5 << 10);
LAB_016038c1:
    dVar5 = anon_unknown_74::unormFloatToChannel((float)swizzled.m_data[1],bits);
    uVar11 = (ushort)(dVar5 << 5) | uVar11;
    dVar5 = anon_unknown_74::unormFloatToChannel((float)swizzled.m_data[2],5);
    uVar2 = (ushort)dVar5;
    goto LAB_01603956;
  case UNORM_SHORT_4444:
    swizzleRB<float>((tcu *)&swizzled,color,RGBA,(this->super_ConstPixelBufferAccess).m_format.order
                    );
    dVar5 = anon_unknown_74::unormFloatToChannel((float)swizzled.m_data[0],4);
    dVar6 = anon_unknown_74::unormFloatToChannel((float)swizzled.m_data[1],4);
    uVar11 = (ushort)(dVar6 << 8) | (ushort)(dVar5 << 0xc);
    dVar5 = anon_unknown_74::unormFloatToChannel((float)swizzled.m_data[2],4);
    dVar6 = anon_unknown_74::unormFloatToChannel((float)swizzled.m_data[3],4);
    uVar2 = (ushort)dVar6 | (ushort)(dVar5 << 4);
    goto LAB_01603956;
  case UNORM_SHORT_5551:
    swizzleRB<float>((tcu *)&swizzled,color,RGBA,(this->super_ConstPixelBufferAccess).m_format.order
                    );
    dVar5 = anon_unknown_74::unormFloatToChannel((float)swizzled.m_data[0],5);
    dVar6 = anon_unknown_74::unormFloatToChannel((float)swizzled.m_data[1],5);
    dVar7 = anon_unknown_74::unormFloatToChannel((float)swizzled.m_data[2],5);
    uVar3 = anon_unknown_74::convertSatRte<unsigned_int>((float)swizzled.m_data[3]);
    *(ushort *)dst =
         (ushort)(uVar3 != 0) | (short)dVar7 * 2 | (ushort)(dVar6 << 6) | (ushort)(dVar5 << 0xb);
    break;
  case UNORM_SHORT_1555:
    src = color->m_data[0];
    src_00 = color->m_data[1];
    src_01 = color->m_data[2];
    uVar3 = anon_unknown_74::convertSatRte<unsigned_int>(color->m_data[3]);
    uVar11 = (ushort)(uVar3 != 0) << 0xf;
    dVar5 = anon_unknown_74::unormFloatToChannel(src,5);
    dVar6 = anon_unknown_74::unormFloatToChannel(src_00,5);
    dVar7 = anon_unknown_74::unormFloatToChannel(src_01,5);
    uVar2 = (ushort)dVar7 | (ushort)(dVar6 << 5) | (ushort)(dVar5 << 10);
LAB_01603956:
    uVar2 = uVar2 | uVar11;
LAB_01603959:
    *(ushort *)dst = uVar2;
    break;
  case UNORM_INT_101010:
    dVar5 = anon_unknown_74::unormFloatToChannel(color->m_data[0],10);
    dVar6 = anon_unknown_74::unormFloatToChannel(color->m_data[1],10);
    uVar4 = dVar6 << 0xc | dVar5 << 0x16;
    dVar5 = anon_unknown_74::unormFloatToChannel(color->m_data[2],10);
    uVar3 = dVar5 << 2;
    goto LAB_01603b13;
  case SNORM_INT_1010102_REV:
    swizzleRB<float>((tcu *)&swizzled,color,RGBA,(this->super_ConstPixelBufferAccess).m_format.order
                    );
    dVar5 = anon_unknown_74::snormFloatToChannel((float)swizzled.m_data[0],10);
    dVar6 = anon_unknown_74::snormFloatToChannel((float)swizzled.m_data[1],10);
    dVar7 = anon_unknown_74::snormFloatToChannel((float)swizzled.m_data[2],10);
    uVar4 = dVar7 << 0x14 | dVar6 << 10 | dVar5;
    dVar5 = anon_unknown_74::snormFloatToChannel((float)swizzled.m_data[3],2);
    uVar3 = dVar5 << 0x1e;
    goto LAB_01603bdb;
  case UNORM_INT_1010102_REV:
    swizzleRB<float>((tcu *)&swizzled,color,RGBA,(this->super_ConstPixelBufferAccess).m_format.order
                    );
    dVar5 = anon_unknown_74::unormFloatToChannel((float)swizzled.m_data[0],10);
    dVar6 = anon_unknown_74::unormFloatToChannel((float)swizzled.m_data[1],10);
    uVar4 = dVar6 << 10 | dVar5;
    dVar5 = anon_unknown_74::unormFloatToChannel((float)swizzled.m_data[2],10);
    dVar6 = anon_unknown_74::unormFloatToChannel((float)swizzled.m_data[3],2);
    uVar3 = dVar6 << 0x1e | dVar5 << 0x14;
LAB_01603b13:
    uVar3 = uVar3 | uVar4;
LAB_01603bdd:
    *dst = uVar3;
    break;
  case UNSIGNED_BYTE_44:
    uVar3 = (uint)(long)color->m_data[0];
    if (0xe < uVar3) {
      uVar3 = 0xf;
    }
    uVar9 = (uint)(long)color->m_data[1];
    uVar4 = 0xf;
    if (uVar9 < 0xf) {
      uVar4 = uVar9;
    }
    *(byte *)dst = (byte)uVar4 | (byte)(uVar3 << 4);
    break;
  case UNSIGNED_SHORT_565:
    Vector<float,_4>::cast<unsigned_int>(&local_44);
    swizzleRB<unsigned_int>
              ((tcu *)&swizzled,(Vector<unsigned_int,_4> *)&local_44,RGB,
               (this->super_ConstPixelBufferAccess).m_format.order);
    if (0x1e < swizzled.m_data[0]) {
      swizzled.m_data[0] = 0x1f;
    }
    uVar3 = 0x3f;
    if (swizzled.m_data[1] < 0x3f) {
      uVar3 = swizzled.m_data[1];
    }
    uVar4 = 0x1f;
    if (swizzled.m_data[2] < 0x1f) {
      uVar4 = swizzled.m_data[2];
    }
    uVar2 = (ushort)uVar4 | (ushort)(uVar3 << 5) | (ushort)(swizzled.m_data[0] << 0xb);
    goto LAB_016037f2;
  case UNSIGNED_SHORT_4444:
    Vector<float,_4>::cast<unsigned_int>(&local_44);
    swizzleRB<unsigned_int>
              ((tcu *)&swizzled,(Vector<unsigned_int,_4> *)&local_44,RGBA,
               (this->super_ConstPixelBufferAccess).m_format.order);
    if (0xe < swizzled.m_data[0]) {
      swizzled.m_data[0] = 0xf;
    }
    if (0xe < swizzled.m_data[1]) {
      swizzled.m_data[1] = 0xf;
    }
    if (0xe < swizzled.m_data[2]) {
      swizzled.m_data[2] = 0xf;
    }
    uVar3 = 0xf;
    if (swizzled.m_data[3] < 0xf) {
      uVar3 = swizzled.m_data[3];
    }
    uVar2 = (ushort)uVar3 | (ushort)(swizzled.m_data[2] << 4) |
            (ushort)(swizzled.m_data[1] << 8) | (ushort)(swizzled.m_data[0] << 0xc);
LAB_016037f2:
    *(ushort *)dst = uVar2;
    break;
  case UNSIGNED_SHORT_5551:
    Vector<float,_4>::cast<unsigned_int>(&local_44);
    swizzleRB<unsigned_int>
              ((tcu *)&swizzled,(Vector<unsigned_int,_4> *)&local_44,RGBA,
               (this->super_ConstPixelBufferAccess).m_format.order);
    if (0x1e < swizzled.m_data[0]) {
      swizzled.m_data[0] = 0x1f;
    }
    if (0x1e < swizzled.m_data[1]) {
      swizzled.m_data[1] = 0x1f;
    }
    uVar3 = 0x1f;
    if (swizzled.m_data[2] < 0x1f) {
      uVar3 = swizzled.m_data[2];
    }
    uVar2 = (ushort)(swizzled.m_data[3] != 0) |
            ((ushort)(swizzled.m_data[1] << 6) | (ushort)(swizzled.m_data[0] << 0xb)) +
            (short)uVar3 * 2;
    goto LAB_01603959;
  case SIGNED_INT_1010102_REV:
    Vector<float,_4>::cast<int>(&local_44);
    swizzleRB<int>((tcu *)&swizzled,(Vector<int,_4> *)&local_44,RGBA,
                   (this->super_ConstPixelBufferAccess).m_format.order);
    if (0x1fe < (int)swizzled.m_data[0]) {
      swizzled.m_data[0] = 0x1ff;
    }
    if ((int)swizzled.m_data[0] < -0x1ff) {
      swizzled.m_data[0] = 0xfffffe00;
    }
    if (0x1fe < (int)swizzled.m_data[1]) {
      swizzled.m_data[1] = 0x1ff;
    }
    if ((int)swizzled.m_data[1] < -0x1ff) {
      swizzled.m_data[1] = 0xfffffe00;
    }
    uVar3 = 0x1ff;
    if ((int)swizzled.m_data[2] < 0x1ff) {
      uVar3 = swizzled.m_data[2];
    }
    if ((int)uVar3 < -0x1ff) {
      uVar3 = 0xfffffe00;
    }
    uVar4 = 1;
    if ((int)swizzled.m_data[3] < 1) {
      uVar4 = swizzled.m_data[3];
    }
    uVar9 = 0xfffffffe;
    if (-2 < (int)uVar4) {
      uVar9 = uVar4;
    }
    *dst = uVar9 << 0x1e |
           (uVar3 & 0x3ff) << 0x14 | (swizzled.m_data[1] & 0x3ff) << 10 | swizzled.m_data[0] & 0x3ff
    ;
    break;
  case UNSIGNED_INT_1010102_REV:
    Vector<float,_4>::cast<unsigned_int>(&local_44);
    swizzleRB<unsigned_int>
              ((tcu *)&swizzled,(Vector<unsigned_int,_4> *)&local_44,RGBA,
               (this->super_ConstPixelBufferAccess).m_format.order);
    if (0x3fe < swizzled.m_data[0]) {
      swizzled.m_data[0] = 0x3ff;
    }
    if (0x3fe < swizzled.m_data[1]) {
      swizzled.m_data[1] = 0x3ff;
    }
    uVar3 = 0x3ff;
    if (swizzled.m_data[2] < 0x3ff) {
      uVar3 = swizzled.m_data[2];
    }
    uVar4 = 3;
    if (swizzled.m_data[3] < 3) {
      uVar4 = swizzled.m_data[3];
    }
    *dst = uVar4 << 0x1e | uVar3 << 0x14 | swizzled.m_data[1] << 10 | swizzled.m_data[0];
    break;
  case UNSIGNED_INT_11F_11F_10F_REV:
    Float<unsigned_int,_5,_6,_15,_2U>::Float
              ((Float<unsigned_int,_5,_6,_15,_2U> *)&swizzled,color->m_data[0]);
    Float<unsigned_int,_5,_6,_15,_2U>::Float
              ((Float<unsigned_int,_5,_6,_15,_2U> *)&local_44,color->m_data[1]);
    uVar4 = (int)local_44.m_data[0] << 0xb | swizzled.m_data[0];
    Float<unsigned_int,_5,_5,_15,_2U>::Float(&local_34,color->m_data[2]);
    uVar3 = local_34.m_value << 0x16;
LAB_01603bdb:
    uVar3 = uVar3 | uVar4;
    goto LAB_01603bdd;
  case UNSIGNED_INT_999_E5_REV:
    uVar3 = packRGB999E5(color);
    goto LAB_01603bdd;
  }
  return;
}

Assistant:

void PixelBufferAccess::setPixel (const Vec4& color, int x, int y, int z) const
{
	DE_ASSERT(de::inBounds(x, 0, getWidth()));
	DE_ASSERT(de::inBounds(y, 0, getHeight()));
	DE_ASSERT(de::inBounds(z, 0, getDepth()));
	DE_ASSERT(!isCombinedDepthStencilType(m_format.type)); // combined types cannot be accessed directly
	DE_ASSERT(m_format.order != TextureFormat::DS); // combined formats cannot be accessed directly

	deUint8* const pixelPtr = (deUint8*)getPixelPtr(x, y, z);

	// Optimized fomats.
	if (m_format.type == TextureFormat::UNORM_INT8)
	{
		if (m_format.order == TextureFormat::RGBA || m_format.order == TextureFormat::sRGBA)
		{
			writeRGBA8888Float(pixelPtr, color);
			return;
		}
		else if (m_format.order == TextureFormat::RGB || m_format.order == TextureFormat::sRGB)
		{
			writeRGB888Float(pixelPtr, color);
			return;
		}
	}

#define PN(VAL, OFFS, BITS)		(unormFloatToChannel((VAL), (BITS)) << (OFFS))
#define PS(VAL, OFFS, BITS)		(snormFloatToChannel((VAL), (BITS)) << (OFFS))
#define PU(VAL, OFFS, BITS)		(uintToChannel((VAL), (BITS)) << (OFFS))
#define PI(VAL, OFFS, BITS)		(intToChannel((VAL), (BITS)) << (OFFS))

	switch (m_format.type)
	{
		case TextureFormat::UNORM_BYTE_44:		*((deUint8 *)pixelPtr) = (deUint8)(PN(color[0], 4, 4) | PN(color[1], 0, 4));						break;
		case TextureFormat::UNSIGNED_BYTE_44:	*((deUint8 *)pixelPtr) = (deUint8)(PU((deUint32)color[0], 4, 4) | PU((deUint32)color[1], 0, 4));	break;
		case TextureFormat::UNORM_INT_101010:	*((deUint32*)pixelPtr) = PN(color[0], 22, 10) | PN(color[1], 12, 10) | PN(color[2], 2, 10);			break;

		case TextureFormat::UNORM_SHORT_565:
		{
			const Vec4 swizzled = swizzleRB(color, TextureFormat::RGB, m_format.order);
			*((deUint16*)pixelPtr) = (deUint16)(PN(swizzled[0], 11, 5) | PN(swizzled[1], 5, 6) | PN(swizzled[2], 0, 5));
			break;
		}

		case TextureFormat::UNSIGNED_SHORT_565:
		{
			const UVec4 swizzled = swizzleRB(color.cast<deUint32>(), TextureFormat::RGB, m_format.order);
			*((deUint16*)pixelPtr) = (deUint16)(PU(swizzled[0], 11, 5) | PU(swizzled[1], 5, 6) | PU(swizzled[2], 0, 5));
			break;
		}

		case TextureFormat::UNORM_SHORT_555:
		{
			const Vec4 swizzled = swizzleRB(color, TextureFormat::RGB, m_format.order);
			*((deUint16*)pixelPtr) = (deUint16)(PN(swizzled[0], 10, 5) | PN(swizzled[1], 5, 5) | PN(swizzled[2], 0, 5));
			break;
		}

		case TextureFormat::UNORM_SHORT_4444:
		{
			const Vec4 swizzled = swizzleRB(color, TextureFormat::RGBA, m_format.order);
			*((deUint16*)pixelPtr) = (deUint16)(PN(swizzled[0], 12, 4) | PN(swizzled[1], 8, 4) | PN(swizzled[2], 4, 4) | PN(swizzled[3], 0, 4));
			break;
		}

		case TextureFormat::UNSIGNED_SHORT_4444:
		{
			const UVec4 swizzled = swizzleRB(color.cast<deUint32>(), TextureFormat::RGBA, m_format.order);
			*((deUint16*)pixelPtr) = (deUint16)(PU(swizzled[0], 12, 4) | PU(swizzled[1], 8, 4) | PU(swizzled[2], 4, 4) | PU(swizzled[3], 0, 4));
			break;
		}

		case TextureFormat::UNORM_SHORT_5551:
		{
			const Vec4 swizzled = swizzleRB(color, TextureFormat::RGBA, m_format.order);
			*((deUint16*)pixelPtr) = (deUint16)(PN(swizzled[0], 11, 5) | PN(swizzled[1], 6, 5) | PN(swizzled[2], 1, 5) | PN(swizzled[3], 0, 1));
			break;
		}

		case TextureFormat::UNORM_SHORT_1555:
		{
			const Vec4 swizzled = color.swizzle(3,0,1,2); // RGBA -> ARGB
			*((deUint16*)pixelPtr) = (deUint16)(PN(swizzled[0], 15, 1) | PN(swizzled[1], 10, 5) | PN(swizzled[2], 5, 5) | PN(swizzled[3], 0, 5));
			break;
		}

		case TextureFormat::UNSIGNED_SHORT_5551:
		{
			const UVec4 swizzled = swizzleRB(color.cast<deUint32>(), TextureFormat::RGBA, m_format.order);
			*((deUint16*)pixelPtr) = (deUint16)(PU(swizzled[0], 11, 5) | PU(swizzled[1], 6, 5) | PU(swizzled[2], 1, 5) | PU(swizzled[3], 0, 1));
			break;
		}

		case TextureFormat::UNORM_INT_1010102_REV:
		{
			const Vec4 u = swizzleRB(color, TextureFormat::RGBA, m_format.order);
			*((deUint32*)pixelPtr) = PN(u[0], 0, 10) | PN(u[1], 10, 10) | PN(u[2], 20, 10) | PN(u[3], 30, 2);
			break;
		}

		case TextureFormat::SNORM_INT_1010102_REV:
		{
			const Vec4 u = swizzleRB(color, TextureFormat::RGBA, m_format.order);
			*((deUint32*)pixelPtr) = PS(u[0], 0, 10) | PS(u[1], 10, 10) | PS(u[2], 20, 10) | PS(u[3], 30, 2);
			break;
		}

		case TextureFormat::UNSIGNED_INT_1010102_REV:
		{
			const UVec4 u = swizzleRB(color.cast<deUint32>(), TextureFormat::RGBA, m_format.order);
			*((deUint32*)pixelPtr) = PU(u[0], 0, 10) | PU(u[1], 10, 10) | PU(u[2], 20, 10) | PU(u[3], 30, 2);
			break;
		}

		case TextureFormat::SIGNED_INT_1010102_REV:
		{
			const IVec4 u = swizzleRB(color.cast<deInt32>(), TextureFormat::RGBA, m_format.order);
			*((deUint32*)pixelPtr) = PI(u[0], 0, 10) | PI(u[1], 10, 10) | PI(u[2], 20, 10) | PI(u[3], 30, 2);
			break;
		}

		case TextureFormat::UNSIGNED_INT_11F_11F_10F_REV:
			*((deUint32*)pixelPtr) = Float11(color[0]).bits() | (Float11(color[1]).bits() << 11) | (Float10(color[2]).bits() << 22);
			break;

		case TextureFormat::UNSIGNED_INT_999_E5_REV:
			*((deUint32*)pixelPtr) = packRGB999E5(color);
			break;

		default:
		{
			// Generic path.
			int								numChannels	= getNumUsedChannels(m_format.order);
			const TextureSwizzle::Channel*	map			= getChannelWriteSwizzle(m_format.order).components;
			int								channelSize	= getChannelSize(m_format.type);

			for (int c = 0; c < numChannels; c++)
			{
				DE_ASSERT(deInRange32(map[c], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3));
				floatToChannel(pixelPtr + channelSize*c, color[map[c]], m_format.type);
			}
			break;
		}
	}

#undef PN
#undef PS
#undef PU
#undef PI
}